

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O2

int ngp_extract_tokens(NGP_RAW_LINE *cl)

{
  char **ppcVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  
  pcVar9 = cl->line;
  if (pcVar9 == (char *)0x0) {
    return 0x16a;
  }
  cl->comment = (char *)0x0;
  cl->format = 0;
  ppcVar1 = &cl->name;
  cl->name = (char *)0x0;
  cl->value = (char *)0x0;
  cl->type = 0;
  lVar5 = 0;
  while( true ) {
    cVar2 = pcVar9[lVar5];
    if ((cVar2 != '\t') && (cVar2 != ' ')) {
      if ((cVar2 != '\n') && (cVar2 != '\0')) {
        pcVar9 = pcVar9 + lVar5;
        *ppcVar1 = pcVar9;
        goto LAB_001b3470;
      }
      *pcVar9 = '\0';
      cl->name = cl->line;
      cl->comment = cl->line;
      goto LAB_001b34c8;
    }
    if ((int)lVar5 == 7) break;
    lVar5 = lVar5 + 1;
  }
  pcVar6 = pcVar9 + 8;
  cl->comment = pcVar6;
  for (; *pcVar6 != '\0'; pcVar6 = pcVar6 + 1) {
    if (*pcVar6 == '\n') {
      *pcVar6 = '\0';
      pcVar9 = cl->line;
      break;
    }
  }
  *pcVar9 = '\0';
  cl->name = cl->line;
LAB_001b34c8:
  cl->type = 7;
  return 0;
LAB_001b3470:
  if ((*pcVar9 == '\0') || (*pcVar9 == '\n')) goto LAB_001b34e0;
  iVar4 = fits_strncasecmp("HIERARCH",pcVar9,8);
  if ((iVar4 == 0) && (pcVar6 = strchr(pcVar9,0x3d), pcVar6 != (char *)0x0)) {
    bVar8 = true;
    pcVar9 = pcVar6;
    if (*pcVar6 == '\0') goto LAB_001b350a;
LAB_001b3502:
    pcVar6 = pcVar9 + 1;
    goto LAB_001b3506;
  }
  cVar2 = *pcVar9;
  if ((cVar2 == '\t') || (cVar2 == ' ')) {
    bVar8 = false;
    goto LAB_001b3502;
  }
  if (cVar2 == '=') {
    bVar8 = true;
    goto LAB_001b3502;
  }
  pcVar9 = pcVar9 + 1;
  goto LAB_001b3470;
LAB_001b34e0:
  bVar8 = false;
  pcVar6 = pcVar9;
LAB_001b3506:
  *pcVar9 = '\0';
LAB_001b350a:
  iVar4 = fits_strcasecmp("HISTORY",*ppcVar1);
  if (((iVar4 != 0) && (iVar4 = fits_strcasecmp("COMMENT",*ppcVar1), iVar4 != 0)) &&
     (iVar4 = fits_strcasecmp("CONTINUE",*ppcVar1), iVar4 != 0)) {
    iVar4 = fits_strcasecmp("\\INCLUDE",*ppcVar1);
    if (iVar4 != 0) {
      do {
        do {
          do {
            pcVar9 = pcVar6;
            pcVar6 = pcVar9 + 1;
            cVar2 = *pcVar9;
          } while (cVar2 == '\t');
        } while (cVar2 == ' ');
        if (cVar2 == '\0') {
          return 0;
        }
        if (cVar2 == '\n') {
          return 0;
        }
      } while ((!bVar8) && (bVar8 = true, cVar2 == '='));
      if (cVar2 == '\'') {
        cl->value = pcVar6;
        cl->type = 2;
        pcVar9 = pcVar6;
        do {
          cVar2 = *pcVar6;
          if (cVar2 == '\'') {
            pcVar7 = pcVar6 + 1;
            cVar3 = pcVar6[1];
            if (cVar3 != '\'') {
              if (cVar3 == '\0') goto LAB_001b36aa;
              if ((cVar3 == '\t') || (cVar3 == ' ')) goto LAB_001b36bf;
              pcVar7 = pcVar6;
              if (cVar3 == '\n') goto LAB_001b36aa;
            }
          }
          else if ((cVar2 == '\n') || (pcVar7 = pcVar6, cVar2 == '\0')) goto LAB_001b36aa;
          pcVar6 = pcVar7 + 1;
          *pcVar9 = cVar2;
          pcVar9 = pcVar9 + 1;
        } while( true );
      }
      if (cVar2 == '/') {
        if ((*pcVar6 == '\t') || (*pcVar6 == ' ')) {
          pcVar6 = pcVar9 + 2;
        }
        cl->comment = pcVar6;
        while( true ) {
          if (*pcVar6 == '\0') {
            return 0;
          }
          if (*pcVar6 == '\n') break;
          pcVar6 = pcVar6 + 1;
        }
        *pcVar6 = '\0';
        return 0;
      }
      cl->value = pcVar9;
      cl->type = 0;
      for (; cVar2 = *pcVar9, cVar2 != '\0'; pcVar9 = pcVar9 + 1) {
        if ((cVar2 == '\t') || (cVar2 == ' ')) {
          pcVar7 = pcVar9 + 1;
LAB_001b36bf:
          *pcVar9 = '\0';
          do {
            do {
              pcVar9 = pcVar7;
              pcVar7 = pcVar9 + 1;
              cVar2 = *pcVar9;
            } while (cVar2 == '\t');
          } while (cVar2 == ' ');
          if (cVar2 == '\0') {
            return 0;
          }
          if (cVar2 == '\n') {
            return 0;
          }
          if (cVar2 == '/') {
            if ((*pcVar7 == '\t') || (*pcVar7 == ' ')) {
              pcVar7 = pcVar9 + 2;
            }
            cl->comment = pcVar7;
            while( true ) {
              if (*pcVar7 == '\0') {
                return 0;
              }
              if (*pcVar7 == '\n') break;
              pcVar7 = pcVar7 + 1;
            }
            *pcVar7 = '\0';
            return 0;
          }
          cl->format = 1;
          return 0;
        }
        if (cVar2 == '\n') break;
      }
LAB_001b36aa:
      *pcVar9 = '\0';
      return 0;
    }
    for (; (*pcVar6 == ' ' || (*pcVar6 == '\t')); pcVar6 = pcVar6 + 1) {
    }
    cl->value = pcVar6;
    do {
      if (*pcVar6 == '\0') {
LAB_001b3626:
        cl->type = 0;
        return 0;
      }
      if (*pcVar6 == '\n') {
        *pcVar6 = '\0';
        goto LAB_001b3626;
      }
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  cl->comment = pcVar6;
  for (; *pcVar6 != '\0'; pcVar6 = pcVar6 + 1) {
    if (*pcVar6 == '\n') {
      *pcVar6 = '\0';
      break;
    }
  }
  goto LAB_001b34c8;
}

Assistant:

int	ngp_extract_tokens(NGP_RAW_LINE *cl)
 { char *p, *s;
   int	cl_flags, i;

   p = cl->line;				/* start from beginning of line */
   if (NULL == p) return(NGP_NUL_PTR);

   cl->name = cl->value = cl->comment = NULL;
   cl->type = NGP_TTYPE_UNKNOWN;
   cl->format = NGP_FORMAT_OK;

   cl_flags = 0;

   for (i=0;; i++)				/* if 8 spaces at beginning then line is comment */
    { if ((0 == *p) || ('\n' == *p))
        {					/* if line has only blanks -> write blank keyword */
          cl->line[0] = 0;			/* create empty name (0 length string) */
          cl->comment = cl->name = cl->line;
	  cl->type = NGP_TTYPE_RAW;		/* signal write unformatted to FITS file */
          return(NGP_OK);
        }
      if ((' ' != *p) && ('\t' != *p)) break;
      if (i >= 7)
        { 
          cl->comment = p + 1;
          for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
           { if ('\n' == *s) *s = 0;
	     if (0 == *s) break;
           }
          cl->line[0] = 0;			/* create empty name (0 length string) */
          cl->name = cl->line;
	  cl->type = NGP_TTYPE_RAW;
          return(NGP_OK);
        }
      p++;
    }

   cl->name = p;

   for (;;)					/* we need to find 1st whitespace */
    { if ((0 == *p) || ('\n' == *p))
        { *p = 0;
          break;
        }

      /*
        from Richard Mathar, 2002-05-03, add 10 lines:
        if upper/lowercase HIERARCH followed also by an equal sign...
      */
      if( fits_strncasecmp("HIERARCH",p,strlen("HIERARCH")) == 0 )
      {
           char * const eqsi=strchr(p,'=') ;
           if( eqsi )
           {
              cl_flags |= NGP_FOUND_EQUAL_SIGN ;
              p=eqsi ;
              break ;
           }
      }

      if ((' ' == *p) || ('\t' == *p)) break;
      if ('=' == *p)
        { cl_flags |= NGP_FOUND_EQUAL_SIGN;
          break;
        }

      p++;
    }

   if (*p) *(p++) = 0;				/* found end of keyname so terminate string with zero */

   if ((!fits_strcasecmp("HISTORY", cl->name))
    || (!fits_strcasecmp("COMMENT", cl->name))
    || (!fits_strcasecmp("CONTINUE", cl->name)))
     { cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       cl->type = NGP_TTYPE_RAW;
       return(NGP_OK);
     }

   if (!fits_strcasecmp("\\INCLUDE", cl->name))
     {
       for (;; p++)  if ((' ' != *p) && ('\t' != *p)) break; /* skip whitespace */

       cl->value = p;
       for (s = cl->value;; s++)		/* filter out any EOS characters */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       cl->type = NGP_TTYPE_UNKNOWN;
       return(NGP_OK);
     }
       
   for (;; p++)
    { if ((0 == *p) || ('\n' == *p))  return(NGP_OK);	/* test if at end of string */
      if ((' ' == *p) || ('\t' == *p)) continue; /* skip whitespace */
      if (cl_flags & NGP_FOUND_EQUAL_SIGN) break;
      if ('=' != *p) break;			/* ignore initial equal sign */
      cl_flags |= NGP_FOUND_EQUAL_SIGN;
    }
      
   if ('/' == *p)				/* no value specified, comment only */
     { p++;
       if ((' ' == *p) || ('\t' == *p)) p++;
       cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       return(NGP_OK);
     }

   if ('\'' == *p)				/* we have found string within quotes */
     { cl->value = s = ++p;			/* set pointer to beginning of that string */
       cl->type = NGP_TTYPE_STRING;		/* signal that it is of string type */

       for (;;)					/* analyze it */
        { if ((0 == *p) || ('\n' == *p))	/* end of line -> end of string */
            { *s = 0; return(NGP_OK); }

          if ('\'' == *p)			/* we have found doublequote */
            { if ((0 == p[1]) || ('\n' == p[1]))/* doublequote is the last character in line */
                { *s = 0; return(NGP_OK); }
              if (('\t' == p[1]) || (' ' == p[1])) /* duoblequote was string terminator */
                { *s = 0; p++; break; }
              if ('\'' == p[1]) p++;		/* doublequote is inside string, convert "" -> " */ 
            }

          *(s++) = *(p++);			/* compact string in place, necess. by "" -> " conversion */
        }
     }
   else						/* regular token */
     { 
       cl->value = p;				/* set pointer to token */
       cl->type = NGP_TTYPE_UNKNOWN;		/* we dont know type at the moment */
       for (;; p++)				/* we need to find 1st whitespace */
        { if ((0 == *p) || ('\n' == *p))
            { *p = 0; return(NGP_OK); }
          if ((' ' == *p) || ('\t' == *p)) break;
        }
       if (*p)  *(p++) = 0;			/* found so terminate string with zero */
     }
       
   for (;; p++)
    { if ((0 == *p) || ('\n' == *p))  return(NGP_OK);	/* test if at end of string */
      if ((' ' != *p) && ('\t' != *p)) break;	/* skip whitespace */
    }
      
   if ('/' == *p)				/* no value specified, comment only */
     { p++;
       if ((' ' == *p) || ('\t' == *p)) p++;
       cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       return(NGP_OK);
     }

   cl->format = NGP_FORMAT_ERROR;
   return(NGP_OK);				/* too many tokens ... */
 }